

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

fio_str_info_s * fio_str_info(fio_str_info_s *__return_storage_ptr__,fio_str_s *s)

{
  size_t sVar1;
  uint64_t local_28;
  fio_str_s *s_local;
  
  if (s == (fio_str_s *)0x0) {
    memset(__return_storage_ptr__,0,0x18);
  }
  else if ((s->small == '\0') && (s->data != (char *)0x0)) {
    if (s->frozen == '\0') {
      local_28 = s->capa;
    }
    else {
      local_28 = 0;
    }
    __return_storage_ptr__->capa = local_28;
    __return_storage_ptr__->len = s->len;
    __return_storage_ptr__->data = s->data;
  }
  else {
    sVar1 = 0x29;
    if (s->frozen != '\0') {
      sVar1 = 0;
    }
    __return_storage_ptr__->capa = sVar1;
    __return_storage_ptr__->len = (long)((int)(uint)s->small >> 1);
    __return_storage_ptr__->data = (char *)s->reserved;
  }
  return __return_storage_ptr__;
}

Assistant:

inline FIO_FUNC fio_str_info_s fio_str_info(const fio_str_s *s) {
  if (!s)
    return (fio_str_info_s){.len = 0};
  return (s->small || !s->data)
             ? (fio_str_info_s){.capa =
                                    (s->frozen ? 0 : (FIO_STR_SMALL_CAPA - 1)),
                                .len = (size_t)(s->small >> 1),
                                .data = FIO_STR_SMALL_DATA(s)}
             : (fio_str_info_s){.capa = (s->frozen ? 0 : s->capa),
                                .len = s->len,
                                .data = s->data};
}